

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int __thiscall
duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>::
next_arg_id(basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  iVar1 = this->next_arg_id_;
  if (iVar1 < 0) {
    std::__cxx11::string::string
              ((string *)&local_30,"cannot switch from manual to automatic argument indexing",
               &local_31);
    on_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    iVar1 = 0;
  }
  else {
    this->next_arg_id_ = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

FMT_CONSTEXPR int next_arg_id() {
    if (next_arg_id_ >= 0) return next_arg_id_++;
    on_error("cannot switch from manual to automatic argument indexing");
    return 0;
  }